

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O3

Config * __thiscall QPDFJob::Config::streamData(Config *this,string *parameter)

{
  int iVar1;
  string local_38;
  
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  stream_data_set = true;
  iVar1 = std::__cxx11::string::compare((char *)parameter);
  if (iVar1 == 0) {
    ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    stream_data_mode = qpdf_s_compress;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)parameter);
    if (iVar1 == 0) {
      ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      stream_data_mode = qpdf_s_preserve;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)parameter);
      if (iVar1 == 0) {
        ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        stream_data_mode = qpdf_s_uncompress;
      }
      else {
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"invalid stream-data option","");
        usage(&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::streamData(std::string const& parameter)
{
    o.m->stream_data_set = true;
    if (parameter == "compress") {
        o.m->stream_data_mode = qpdf_s_compress;
    } else if (parameter == "preserve") {
        o.m->stream_data_mode = qpdf_s_preserve;
    } else if (parameter == "uncompress") {
        o.m->stream_data_mode = qpdf_s_uncompress;
    } else {
        usage("invalid stream-data option");
    }
    return this;
}